

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyShow.c
# Opt level: O0

void Ivy_ManShow(Ivy_Man_t *pMan,int fHaig,Vec_Ptr_t *vBold)

{
  FILE *__stream;
  FILE *pFile;
  char FileNameDot [200];
  Vec_Ptr_t *vBold_local;
  int fHaig_local;
  Ivy_Man_t *pMan_local;
  
  Ivy_ManShow::Counter = Ivy_ManShow::Counter + 1;
  FileNameDot._192_8_ = vBold;
  sprintf((char *)&pFile,"temp%02d.dot");
  __stream = fopen((char *)&pFile,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",&pFile);
  }
  else {
    fclose(__stream);
    Ivy_WriteDotAig(pMan,(char *)&pFile,fHaig,(Vec_Ptr_t *)FileNameDot._192_8_);
    Abc_ShowFile((char *)&pFile);
  }
  return;
}

Assistant:

void Ivy_ManShow( Ivy_Man_t * pMan, int fHaig, Vec_Ptr_t * vBold )
{
    extern void Abc_ShowFile( char * FileNameDot );
    static int Counter = 0;
    char FileNameDot[200];
    FILE * pFile;
    // create the file name
//    Ivy_ShowGetFileName( pMan->pName, FileNameDot );
    sprintf( FileNameDot, "temp%02d.dot", Counter++ );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    fclose( pFile );
    // generate the file
    Ivy_WriteDotAig( pMan, FileNameDot, fHaig, vBold );
    // visualize the file 
    Abc_ShowFile( FileNameDot );
}